

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O0

double Memory::CustomHeap::log2(double __x)

{
  ulong in_RDI;
  int local_50;
  int i;
  uint result;
  uint S [5];
  uint local_28 [2];
  uint b [5];
  size_t number_local;
  
  b[0] = 0xf0;
  b[1] = 0xff00;
  b[2] = 0xffff0000;
  _i = 0x200000001;
  S[0] = 4;
  S[1] = 8;
  S[2] = 0x10;
  unique0x1000006e = in_RDI;
  for (local_50 = 4; -1 < local_50; local_50 = local_50 + -1) {
    if ((stack0xfffffffffffffff0 & b[(long)local_50 + -2]) != 0) {
      register0x00000000 = stack0xfffffffffffffff0 >> ((byte)(&i)[local_50] & 0x3f);
    }
  }
  return __x;
}

Assistant:

inline unsigned int log2(size_t number)
{
    const unsigned int b[] = {0x2, 0xC, 0xF0, 0xFF00, 0xFFFF0000};
    const unsigned int S[] = {1, 2, 4, 8, 16};

    unsigned int result = 0;
    for (int i = 4; i >= 0; i--)
    {
        if (number & b[i])
        {
            number >>= S[i];
            result |= S[i];
        }
    }

    return result;
}